

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

word If_CluDeriveDisjoint(word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r)

{
  int nVars_00;
  int iVar1;
  int nFSset;
  int RetValue;
  int i;
  word pCofs [3] [256];
  If_Grp_t *r_local;
  If_Grp_t *g_local;
  int *P2V_local;
  int *V2P_local;
  int nVars_local;
  word *pF_local;
  
  nVars_00 = nVars - g->nVars;
  pCofs[2][0xff] = (word)r;
  If_CluCountCofs(pF,nVars,(int)g->nVars,0,(word (*) [256])&RetValue);
  if (nVars_00 < 6) {
    *pF = pCofs[0][0xff] << ((byte)(1 << ((byte)nVars_00 & 0x1f)) & 0x3f) | _RetValue;
  }
  else {
    If_CluCopy(pF,(word *)&RetValue,nVars_00);
    iVar1 = If_CluWordNum(nVars_00);
    If_CluCopy(pF + iVar1,pCofs[0] + 0xff,nVars_00);
  }
  if (pCofs[2][0xff] != 0) {
    *(byte *)pCofs[2][0xff] = (byte)nVars_00 + 1;
    *(undefined1 *)(pCofs[2][0xff] + 1) = 0;
    for (nFSset = 0; nFSset < nVars_00; nFSset = nFSset + 1) {
      *(char *)(pCofs[2][0xff] + 2 + (long)nFSset) = (char)P2V[nFSset];
    }
    *(char *)(pCofs[2][0xff] + 2 + (long)nVars_00) = (char)nVars;
  }
  return pCofs[1][0xff];
}

Assistant:

word If_CluDeriveDisjoint( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r )
{
    word pCofs[3][CLU_WRD_MAX/4];
    int i, RetValue, nFSset = nVars - g->nVars;
    RetValue = If_CluCountCofs( pF, nVars, g->nVars, 0, pCofs );
//    assert( RetValue == 2 );

    if ( nFSset < 6 )
        pF[0] = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    else
    {
        If_CluCopy( pF, pCofs[0], nFSset );
        If_CluCopy( pF + If_CluWordNum(nFSset), pCofs[1], nFSset );
    }
    // create the resulting group
    if ( r )
    {
        r->nVars = nFSset + 1;
        r->nMyu = 0;
        for ( i = 0; i < nFSset; i++ )
            r->pVars[i] = P2V[i];
        r->pVars[nFSset] = nVars;
    }
    return pCofs[2][0];
}